

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

void __thiscall
testing::internal::ExpectationBase::FindUnsatisfiedPrerequisites
          (ExpectationBase *this,ExpectationSet *result)

{
  ExpectationBase *pEVar1;
  ExpectationBase *pEVar2;
  element_type *peVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  ExpectationBase *__tmp;
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  expectations;
  ExpectationBase *next;
  ExpectationBase **local_58;
  iterator iStack_50;
  ExpectationBase **local_48;
  ExpectationBase *local_38;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  local_58 = (ExpectationBase **)0x0;
  iStack_50._M_current = (ExpectationBase **)0x0;
  local_48 = (ExpectationBase **)0x0;
  local_58 = (ExpectationBase **)operator_new(8);
  iStack_50._M_current = local_58 + 1;
  *local_58 = this;
  local_48 = iStack_50._M_current;
  if (local_58 != iStack_50._M_current) {
    do {
      pEVar1 = iStack_50._M_current[-1];
      iStack_50._M_current = iStack_50._M_current + -1;
      for (p_Var5 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 !=
          &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        pEVar2 = *(ExpectationBase **)(p_Var5 + 1);
        local_38 = pEVar2;
        MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
        peVar3 = (pEVar2->cardinality_).impl_.
                 super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        iVar4 = (*peVar3->_vptr_CardinalityInterface[4])(peVar3,(ulong)(uint)pEVar2->call_count_);
        if ((char)iVar4 == '\0') {
          std::
          _Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
          ::_M_insert_unique<testing::Expectation_const&>
                    ((_Rb_tree<testing::Expectation,testing::Expectation,std::_Identity<testing::Expectation>,testing::Expectation::Less,std::allocator<testing::Expectation>>
                      *)result,(Expectation *)(p_Var5 + 1));
        }
        else if (local_38->call_count_ == 0) {
          if (iStack_50._M_current == local_48) {
            std::
            vector<testing::internal::ExpectationBase_const*,std::allocator<testing::internal::ExpectationBase_const*>>
            ::_M_realloc_insert<testing::internal::ExpectationBase_const*const&>
                      ((vector<testing::internal::ExpectationBase_const*,std::allocator<testing::internal::ExpectationBase_const*>>
                        *)&local_58,iStack_50,&local_38);
          }
          else {
            *iStack_50._M_current = local_38;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
        }
      }
    } while (local_58 != iStack_50._M_current);
  }
  if (local_58 != (ExpectationBase **)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  ::std::vector<const ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    const ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      const ExpectationBase* next = it->expectation_base().get();

      if (next->IsSatisfied()) {
        // If *it is satisfied and has a call count of 0, some of its
        // pre-requisites may not be satisfied yet.
        if (next->call_count_ == 0) {
          expectations.push_back(next);
        }
      } else {
        // Now that we know next is unsatisfied, we are not so interested
        // in whether its pre-requisites are satisfied.  Therefore we
        // don't iterate into it here.
        *result += *it;
      }
    }
  }
}